

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

double __thiscall
ImPlot::PlotHistogram<short>
          (ImPlot *this,char *label_id,short *values,int count,int bins,bool cumulative,bool density
          ,ImPlotRange range,bool outliers,double bar_scale)

{
  ImPlotContext *pIVar1;
  bool bVar2;
  int i_00;
  ImVector<double> *this_00;
  ImVector<double> *this_01;
  double *pdVar3;
  double dVar4;
  double dVar5;
  int local_fc;
  int local_dc;
  int local_b4;
  int b_5;
  double scale_1;
  int b_4;
  int b_3;
  double scale;
  int b_2;
  int b_1;
  double val;
  double dStack_80;
  int i;
  double max_count;
  int local_70;
  int counted;
  int b;
  int below;
  ImVector<double> *bin_counts;
  ImVector<double> *bin_centers;
  double width;
  short Max;
  double dStack_48;
  short Min;
  double bar_scale_local;
  int local_38;
  bool outliers_local;
  bool density_local;
  int iStack_34;
  bool cumulative_local;
  int bins_local;
  int count_local;
  short *values_local;
  char *label_id_local;
  ImPlotRange range_local;
  
  range_local.Min = range.Max;
  label_id_local = (char *)range.Min;
  iStack_34 = (int)values;
  bar_scale_local._7_1_ = (byte)bins & 1;
  bar_scale_local._5_1_ = density;
  if ((iStack_34 < 1) || (count == 0)) {
    range_local.Max = 0.0;
  }
  else {
    dStack_48 = bar_scale;
    bar_scale_local._6_1_ = cumulative;
    local_38 = count;
    _bins_local = (short *)label_id;
    values_local = (short *)this;
    if (((((double)label_id_local == 0.0) && (!NAN((double)label_id_local))) &&
        (range_local.Min == 0.0)) && (!NAN(range_local.Min))) {
      ImMinMaxArray<short>
                ((short *)label_id,iStack_34,(short *)((long)&width + 6),(short *)((long)&width + 4)
                );
      label_id_local = (char *)(double)(int)width._6_2_;
      range_local.Min = (double)(int)width._4_2_;
    }
    if (local_38 < 0) {
      CalculateBins<short>
                (_bins_local,iStack_34,local_38,(ImPlotRange *)&label_id_local,&local_38,
                 (double *)&bin_centers);
    }
    else {
      dVar4 = ImPlotRange::Size((ImPlotRange *)&label_id_local);
      bin_centers = (ImVector<double> *)(dVar4 / (double)local_38);
    }
    pIVar1 = GImPlot;
    this_00 = &GImPlot->Temp1;
    this_01 = &GImPlot->Temp2;
    ImVector<double>::resize(this_00,local_38);
    ImVector<double>::resize(this_01,local_38);
    counted = 0;
    for (local_70 = 0; local_70 < local_38; local_70 = local_70 + 1) {
      dVar5 = (double)local_70 * (double)bin_centers + (double)label_id_local;
      dVar4 = (double)bin_centers * 0.5;
      pdVar3 = ImVector<double>::operator[](this_00,local_70);
      *pdVar3 = dVar4 + dVar5;
      pdVar3 = ImVector<double>::operator[](this_01,local_70);
      *pdVar3 = 0.0;
    }
    max_count._4_4_ = 0;
    dStack_80 = 0.0;
    for (val._4_4_ = 0; val._4_4_ < iStack_34; val._4_4_ = val._4_4_ + 1) {
      dVar4 = (double)(int)_bins_local[val._4_4_];
      bVar2 = ImPlotRange::Contains((ImPlotRange *)&label_id_local,dVar4);
      if (bVar2) {
        i_00 = ImClamp<int>((int)((dVar4 - (double)label_id_local) / (double)bin_centers),0,
                            local_38 + -1);
        pdVar3 = ImVector<double>::operator[](this_01,i_00);
        *pdVar3 = *pdVar3 + 1.0;
        pdVar3 = ImVector<double>::operator[](this_01,i_00);
        if (dStack_80 < *pdVar3) {
          pdVar3 = ImVector<double>::operator[](this_01,i_00);
          dStack_80 = *pdVar3;
        }
        max_count._4_4_ = max_count._4_4_ + 1;
      }
      else if (dVar4 < (double)label_id_local) {
        counted = counted + 1;
      }
    }
    if (((bar_scale_local._7_1_ & 1) == 0) || ((bar_scale_local._6_1_ & 1) == 0)) {
      if ((bar_scale_local._7_1_ & 1) == 0) {
        if ((bar_scale_local._6_1_ & 1) != 0) {
          if ((bar_scale_local._5_1_ & 1) == 0) {
            local_fc = max_count._4_4_;
          }
          else {
            local_fc = iStack_34;
          }
          dVar4 = 1.0 / ((double)local_fc * (double)bin_centers);
          for (local_b4 = 0; local_b4 < local_38; local_b4 = local_b4 + 1) {
            pdVar3 = ImVector<double>::operator[](this_01,local_b4);
            *pdVar3 = dVar4 * *pdVar3;
          }
          dStack_80 = dVar4 * dStack_80;
        }
      }
      else {
        if ((bar_scale_local._5_1_ & 1) != 0) {
          pdVar3 = ImVector<double>::operator[](this_01,0);
          *pdVar3 = (double)counted + *pdVar3;
        }
        for (scale_1._0_4_ = 1; scale_1._0_4_ < local_38; scale_1._0_4_ = scale_1._0_4_ + 1) {
          pdVar3 = ImVector<double>::operator[](this_01,scale_1._0_4_ + -1);
          dVar4 = *pdVar3;
          pdVar3 = ImVector<double>::operator[](this_01,scale_1._0_4_);
          *pdVar3 = dVar4 + *pdVar3;
        }
        pdVar3 = ImVector<double>::operator[](this_01,local_38 + -1);
        dStack_80 = *pdVar3;
      }
    }
    else {
      if ((bar_scale_local._5_1_ & 1) != 0) {
        pdVar3 = ImVector<double>::operator[](this_01,0);
        *pdVar3 = (double)counted + *pdVar3;
      }
      for (scale._0_4_ = 1; scale._0_4_ < local_38; scale._0_4_ = scale._0_4_ + 1) {
        pdVar3 = ImVector<double>::operator[](this_01,scale._0_4_ + -1);
        dVar4 = *pdVar3;
        pdVar3 = ImVector<double>::operator[](this_01,scale._0_4_);
        *pdVar3 = dVar4 + *pdVar3;
      }
      if ((bar_scale_local._5_1_ & 1) == 0) {
        local_dc = max_count._4_4_;
      }
      else {
        local_dc = iStack_34;
      }
      for (scale_1._4_4_ = 0; scale_1._4_4_ < local_38; scale_1._4_4_ = scale_1._4_4_ + 1) {
        pdVar3 = ImVector<double>::operator[](this_01,scale_1._4_4_);
        *pdVar3 = (1.0 / (double)local_dc) * *pdVar3;
      }
      pdVar3 = ImVector<double>::operator[](this_01,local_38 + -1);
      dStack_80 = *pdVar3;
    }
    PlotBars<double>((char *)values_local,(pIVar1->Temp1).Data,(pIVar1->Temp2).Data,local_38,
                     dStack_48 * (double)bin_centers,0,8);
    range_local.Max = dStack_80;
  }
  return range_local.Max;
}

Assistant:

double PlotHistogram(const char* label_id, const T* values, int count, int bins, bool cumulative, bool density, ImPlotRange range, bool outliers, double bar_scale) {

    if (count <= 0 || bins == 0)
        return 0;

    if (range.Min == 0 && range.Max == 0) {
        T Min, Max;
        ImMinMaxArray(values, count, &Min, &Max);
        range.Min = (double)Min;
        range.Max = (double)Max;
    }

    double width;
    if (bins < 0)
        CalculateBins(values, count, bins, range, bins, width);
    else
        width = range.Size() / bins;

    ImVector<double>& bin_centers = GImPlot->Temp1;
    ImVector<double>& bin_counts  = GImPlot->Temp2;
    bin_centers.resize(bins);
    bin_counts.resize(bins);
    int below = 0;

    for (int b = 0; b < bins; ++b) {
        bin_centers[b] = range.Min + b * width + width * 0.5;
        bin_counts[b] = 0;
    }
    int counted = 0;
    double max_count = 0;
    for (int i = 0; i < count; ++i) {
        double val = (double)values[i];
        if (range.Contains(val)) {
            const int b = ImClamp((int)((val - range.Min) / width), 0, bins - 1);
            bin_counts[b] += 1.0;
            if (bin_counts[b] > max_count)
                max_count = bin_counts[b];
            counted++;
        }
        else if (val < range.Min) {
            below++;
        }
    }
    if (cumulative && density) {
        if (outliers)
            bin_counts[0] += below;
        for (int b = 1; b < bins; ++b)
            bin_counts[b] += bin_counts[b-1];
        double scale = 1.0 / (outliers ? count : counted);
        for (int b = 0; b < bins; ++b)
            bin_counts[b] *= scale;
        max_count = bin_counts[bins-1];
    }
    else if (cumulative) {
        if (outliers)
            bin_counts[0] += below;
        for (int b = 1; b < bins; ++b)
            bin_counts[b] += bin_counts[b-1];
        max_count = bin_counts[bins-1];
    }
    else if (density) {
        double scale = 1.0 / ((outliers ? count : counted) * width);
        for (int b = 0; b < bins; ++b)
            bin_counts[b] *= scale;
        max_count *= scale;
    }
    PlotBars(label_id, &bin_centers.Data[0], &bin_counts.Data[0], bins, bar_scale*width);
    return max_count;
}